

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-client.c
# Opt level: O2

int callback_test_raw_client(lws *wsi,lws_callback_reasons reason,void *user,void *in,size_t len)

{
  char *format;
  
  switch(reason) {
  case LWS_CALLBACK_RAW_RX:
    _lws_log(4,"LWS_CALLBACK_RAW_RX %ld\n",len);
    puts((char *)in);
    return 0;
  case LWS_CALLBACK_RAW_CLOSE:
    format = "LWS_CALLBACK_RAW_CLOSE\n";
    break;
  case LWS_CALLBACK_RAW_WRITEABLE:
    format = "LWS_CALLBACK_RAW_WRITEABLE\n";
    break;
  case LWS_CALLBACK_RAW_ADOPT:
    format = "LWS_CALLBACK_RAW_ADOPT\n";
    break;
  default:
    goto switchD_0010d0cd_default;
  }
  _lws_log(4,format);
switchD_0010d0cd_default:
  return 0;
}

Assistant:

static int
callback_test_raw_client(struct lws *wsi, enum lws_callback_reasons reason,
			 void *user, void *in, size_t len)
{
	switch (reason) {
	case LWS_CALLBACK_RAW_ADOPT:
		lwsl_notice("LWS_CALLBACK_RAW_ADOPT\n");
		break;

	case LWS_CALLBACK_RAW_RX:
		lwsl_notice("LWS_CALLBACK_RAW_RX %ld\n", (long)len);
		puts(in);
		break;

	case LWS_CALLBACK_RAW_CLOSE:
		lwsl_notice("LWS_CALLBACK_RAW_CLOSE\n");
		break;

	case LWS_CALLBACK_RAW_WRITEABLE:
		lwsl_notice("LWS_CALLBACK_RAW_WRITEABLE\n");
		break;

	default:
		break;
	}

	return 0;
}